

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_canvas.cpp
# Opt level: O0

pair<float,_float> sinStrokeFunction(Coordf x0,Coordf x1)

{
  double dVar1;
  pair<float,_float> pVar2;
  float local_20;
  float local_1c;
  Coordf end;
  Coordf base;
  Coordf x1_local;
  Coordf x0_local;
  
  end = x1;
  base = x0;
  dVar1 = std::sin((double)(ulong)(uint)(((x0 - 0.086) / 0.211) * 6.283184));
  local_1c = SUB84(dVar1,0) * -0.072 + 0.422;
  dVar1 = std::sin((double)(ulong)(uint)(((end - 0.086) / 0.211) * 6.283184));
  local_20 = SUB84(dVar1,0) * -0.072 + 0.422;
  pVar2 = std::make_pair<float&,float&>(&local_1c,&local_20);
  return pVar2;
}

Assistant:

std::pair<Coordf,Coordf> sinStrokeFunction(Coordf x0, Coordf x1) {
    // To understand the apparently random numbers below (0.422, 0.072, 0.086),
    // see line 135
    Coordf base = 0.422f - 0.072f*std::sin(2*3.141592f*((x0 - 0.086f)/0.211f));
    Coordf end  = 0.422f - 0.072f*std::sin(2*3.141592f*((x1 - 0.086f)/0.211f));

    // When stroke width (end - base) maps to less than 1px, it will be
    // rounded automatically to 1px
    return std::make_pair(base, end);
}